

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O2

int testDynamicLoader(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  string libname;
  
  if (argc == 3) {
    iVar1 = TestDynamicLoader(argv[1],argv[2],1,1,1);
    return iVar1;
  }
  iVar1 = TestDynamicLoader("azerty_","foo_bar",0,0,0);
  iVar2 = TestDynamicLoader("/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/kwsys/testSystemTools.bin"
                            ,"wp",0,0,0);
  iVar3 = TestDynamicLoader("foobar.lib","dlopen",0,1,0);
  iVar4 = TestDynamicLoader("libdl.so","dlopen",1,1,1);
  iVar5 = TestDynamicLoader("libdl.so","TestDynamicLoader",1,0,1);
  libname._M_dataplus._M_p = (pointer)&libname.field_2;
  libname._M_string_length = 0;
  libname.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&libname);
  std::__cxx11::string::append((char *)&libname);
  std::__cxx11::string::append((char *)&libname);
  std::__cxx11::string::append((char *)&libname);
  std::__cxx11::string::append((char *)&libname);
  iVar6 = TestDynamicLoader(libname._M_dataplus._M_p,"dummy",1,0,1);
  iVar7 = TestDynamicLoader(libname._M_dataplus._M_p,"TestDynamicLoaderSymbolPointer",1,1,1);
  iVar8 = TestDynamicLoader(libname._M_dataplus._M_p,"_TestDynamicLoaderSymbolPointer",1,0,1);
  iVar9 = TestDynamicLoader(libname._M_dataplus._M_p,"TestDynamicLoaderData",1,1,1);
  iVar10 = TestDynamicLoader(libname._M_dataplus._M_p,"_TestDynamicLoaderData",1,0,1);
  std::__cxx11::string::~string((string *)&libname);
  return iVar9 + iVar10 + iVar7 + iVar8 + iVar3 + iVar4 + iVar2 + iVar1 + iVar5 + iVar6;
}

Assistant:

int testDynamicLoader(int argc, char *argv[])
{
#if defined(_WIN32)
  SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#elif defined(__BEOS__) || defined(__HAIKU__)
  disable_debugger(1);
#endif
  int res = 0;
  if( argc == 3 )
    {
    // User specify a libname and symbol to check.
    res = TestDynamicLoader(argv[1], argv[2],1,1,1);
    return res;
    }

// dlopen() on Syllable before 11/22/2007 doesn't return 0 on error
#ifndef __SYLLABLE__
  // Make sure that inexistent lib is giving correct result
  res += TestDynamicLoader("azerty_", "foo_bar",0,0,0);
  // Make sure that random binary file cannot be assimilated as dylib
  res += TestDynamicLoader(TEST_SYSTEMTOOLS_SOURCE_DIR "/testSystemTools.bin", "wp",0,0,0);
#endif

#ifdef __linux__
  // This one is actually fun to test, since dlopen is by default loaded...wonder why :)
  res += TestDynamicLoader("foobar.lib", "dlopen",0,1,0);
  res += TestDynamicLoader("libdl.so", "dlopen",1,1,1);
  res += TestDynamicLoader("libdl.so", "TestDynamicLoader",1,0,1);
#endif
  // Now try on the generated library
  std::string libname = GetLibName(KWSYS_NAMESPACE_STRING "TestDynload");
  res += TestDynamicLoader(libname.c_str(), "dummy",1,0,1);
  res += TestDynamicLoader(libname.c_str(), "TestDynamicLoaderSymbolPointer",1,1,1);
  res += TestDynamicLoader(libname.c_str(), "_TestDynamicLoaderSymbolPointer",1,0,1);
  res += TestDynamicLoader(libname.c_str(), "TestDynamicLoaderData",1,1,1);
  res += TestDynamicLoader(libname.c_str(), "_TestDynamicLoaderData",1,0,1);

  return res;
}